

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numberformatter.h
# Opt level: O0

void __thiscall icu_63::number::impl::MacroProps::MacroProps(MacroProps *this,MacroProps *param_1)

{
  UNumberSignDisplay UVar1;
  MacroProps *param_1_local;
  MacroProps *this_local;
  
  (this->notation).fUnion.scientific.fExponentSignDisplay =
       (param_1->notation).fUnion.scientific.fExponentSignDisplay;
  *(undefined8 *)&this->notation = *(undefined8 *)&param_1->notation;
  MeasureUnit::MeasureUnit(&this->unit,&param_1->unit);
  MeasureUnit::MeasureUnit(&this->perUnit,&param_1->perUnit);
  memcpy(&this->precision,&param_1->precision,0x45);
  SymbolsWrapper::SymbolsWrapper(&this->symbols,&param_1->symbols);
  UVar1 = param_1->sign;
  this->unitWidth = param_1->unitWidth;
  this->sign = UVar1;
  this->decimal = param_1->decimal;
  Scale::Scale(&this->scale,&param_1->scale);
  this->affixProvider = param_1->affixProvider;
  this->rules = param_1->rules;
  this->currencySymbols = param_1->currencySymbols;
  this->threshold = param_1->threshold;
  Locale::Locale(&this->locale,&param_1->locale);
  return;
}

Assistant:

struct U_I18N_API MacroProps : public UMemory {
    /** @internal */
    Notation notation;

    /** @internal */
    MeasureUnit unit; // = NoUnit::base();

    /** @internal */
    MeasureUnit perUnit; // = NoUnit::base();

    /** @internal */
    Precision precision;  // = Precision();  (bogus)

    /** @internal */
    UNumberFormatRoundingMode roundingMode = UNUM_ROUND_HALFEVEN;

    /** @internal */
    Grouper grouper;  // = Grouper();  (bogus)

    /** @internal */
    Padder padder;    // = Padder();   (bogus)

    /** @internal */
    IntegerWidth integerWidth; // = IntegerWidth(); (bogus)

    /** @internal */
    SymbolsWrapper symbols;

    // UNUM_XYZ_COUNT denotes null (bogus) values.

    /** @internal */
    UNumberUnitWidth unitWidth = UNUM_UNIT_WIDTH_COUNT;

    /** @internal */
    UNumberSignDisplay sign = UNUM_SIGN_COUNT;

    /** @internal */
    UNumberDecimalSeparatorDisplay decimal = UNUM_DECIMAL_SEPARATOR_COUNT;

    /** @internal */
    Scale scale;  // = Scale();  (benign value)

    /** @internal */
    const AffixPatternProvider* affixProvider = nullptr;  // no ownership

    /** @internal */
    const PluralRules* rules = nullptr;  // no ownership

    /** @internal */
    const CurrencySymbols* currencySymbols = nullptr;  // no ownership

    /** @internal */
    int32_t threshold = DEFAULT_THRESHOLD;

    /** @internal */
    Locale locale;

    // NOTE: Uses default copy and move constructors.

    /**
     * Check all members for errors.
     * @internal
     */
    bool copyErrorTo(UErrorCode &status) const {
        return notation.copyErrorTo(status) || precision.copyErrorTo(status) ||
               padder.copyErrorTo(status) || integerWidth.copyErrorTo(status) ||
               symbols.copyErrorTo(status) || scale.copyErrorTo(status);
    }
}